

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall calculator::Lexer::putWord(Lexer *this,string *id)

{
  bool bVar1;
  Word *this_00;
  mapped_type *this_01;
  shared_ptr<calculator::Token> local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
  local_20;
  string *local_18;
  string *id_local;
  Lexer *this_local;
  
  local_18 = id;
  id_local = (string *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>_>
       ::find(&this->variable,id);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>_>
       ::end(&this->variable);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    this_00 = (Word *)operator_new(0x70);
    Word::Word(this_00,local_18,false,Identifier);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Word,void>(&local_38,this_00);
    this_01 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>_>
              ::operator[](&this->variable,local_18);
    std::shared_ptr<calculator::Token>::operator=(this_01,&local_38);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_38);
  }
  return;
}

Assistant:

void putWord(const std::string& id) {
        if (variable.find(id) == variable.end())
            variable[id] = std::shared_ptr<Token>(new Word(id));
    }